

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void libtorrent::dht::anon_unknown_20::get_mutable_item_callback
               (item *it,bool authoritative,
               shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx> *ctx,
               function<void_(const_libtorrent::dht::item_&,_bool)> *f)

{
  element_type *peVar1;
  data_type dVar2;
  undefined8 in_RAX;
  long lVar3;
  bool *pbVar4;
  undefined7 in_register_00000031;
  public_key *ppVar5;
  public_key *ppVar6;
  bool bVar7;
  byte bVar8;
  undefined8 uStack_28;
  
  bVar8 = 0;
  if ((int)CONCAT71(in_register_00000031,authoritative) == 0) {
    bVar7 = false;
  }
  else {
    peVar1 = (ctx->
             super___shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    peVar1->active_traversals = peVar1->active_traversals + -1;
    bVar7 = peVar1->active_traversals == 0;
  }
  uStack_28 = in_RAX;
  dVar2 = entry::type(&(((ctx->
                         super___shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->it).m_value);
  if (((dVar2 == undefined_t) && (dVar2 = entry::type(&it->m_value), dVar2 != undefined_t)) ||
     ((((ctx->
        super___shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr)->it).m_seq.value < (it->m_seq).value)) {
    peVar1 = (ctx->
             super___shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    entry::operator=(&(peVar1->it).m_value,&it->m_value);
    ::std::__cxx11::string::_M_assign((string *)&(peVar1->it).m_salt);
    ppVar5 = &it->m_pk;
    ppVar6 = &(peVar1->it).m_pk;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)(ppVar6->bytes)._M_elems = *(undefined8 *)(ppVar5->bytes)._M_elems;
      ppVar5 = (public_key *)((long)ppVar5 + (ulong)bVar8 * -0x10 + 8);
      ppVar6 = (public_key *)((long)ppVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    (peVar1->it).m_seq.value = (it->m_seq).value;
    (peVar1->it).m_mutable = it->m_mutable;
    uStack_28._0_7_ = CONCAT16(bVar7,(undefined6)uStack_28);
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_003bb50c:
      ::std::__throw_bad_function_call();
    }
    pbVar4 = (bool *)((long)&uStack_28 + 6);
  }
  else {
    if (bVar7 == false) {
      return;
    }
    uStack_28 = CONCAT17(1,(undefined7)uStack_28);
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003bb50c;
    pbVar4 = (bool *)((long)&uStack_28 + 7);
  }
  (*f->_M_invoker)((_Any_data *)f,it,pbVar4);
  return;
}

Assistant:

void get_mutable_item_callback(item const& it, bool authoritative
		, std::shared_ptr<get_mutable_item_ctx> ctx
		, std::function<void(item const&, bool)> f)
	{
		TORRENT_ASSERT(it.is_mutable());
		if (authoritative) --ctx->active_traversals;
		authoritative = authoritative && ctx->active_traversals == 0;
		if ((ctx->it.empty() && !it.empty()) || (ctx->it.seq() < it.seq()))
		{
			ctx->it = it;
			f(it, authoritative);
		}
		else if (authoritative)
			f(it, authoritative);
	}